

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddMacro(cmMakefile *this,char *name)

{
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (name != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_30,name,&local_31);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MacrosList,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmMakefile.cxx"
                ,0xe98,"void cmMakefile::AddMacro(const char *)");
}

Assistant:

void cmMakefile::AddMacro(const char* name)
{
  assert(name);
  this->MacrosList.push_back(name);
}